

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O1

int unzeof(unzFile file)

{
  uint uVar1;
  
  uVar1 = 0xffffff9a;
  if ((file != (unzFile)0x0) && (*(long *)((long)file + 0x140) != 0)) {
    uVar1 = (uint)(*(long *)(*(long *)((long)file + 0x140) + 0xc0) == 0);
  }
  return uVar1;
}

Assistant:

extern int ZEXPORT unzeof(unzFile file)
{
    unz64_s* s;
    file_in_zip64_read_info_s* pfile_in_zip_read_info;
    if (file == NULL)
        return UNZ_PARAMERROR;
    s = (unz64_s*)file;
    pfile_in_zip_read_info = s->pfile_in_zip_read;

    if (pfile_in_zip_read_info == NULL)
        return UNZ_PARAMERROR;

    if (pfile_in_zip_read_info->rest_read_uncompressed == 0)
        return 1;
    else
        return 0;
}